

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall Lowerer::GenerateLdFuncObj(Lowerer *this,Instr *instr)

{
  Opnd *dst;
  Opnd *local_28;
  Opnd *functionObjOpnd;
  
  dst = instr->m_dst;
  local_28 = (Opnd *)0x0;
  LowererMD::LoadFunctionObjectOpnd(&this->m_lowererMD,instr,&local_28);
  InsertMove(dst,local_28,instr,true);
  IR::Instr::Remove(instr);
  return;
}

Assistant:

void
Lowerer::GenerateLdFuncObj(IR::Instr* instr)
{
    //  MOV dst, functionObject  // functionObject through stack params or src1

    IR::Opnd *dstOpnd = instr->GetDst();
    IR::Opnd *functionObjOpnd = nullptr;

    m_lowererMD.LoadFunctionObjectOpnd(instr, functionObjOpnd);
    Lowerer::InsertMove(dstOpnd, functionObjOpnd, instr);
    instr->Remove();
}